

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O0

void __thiscall irr::COSOperator::copyToPrimarySelection(COSOperator *this,c8 *text)

{
  char *in_RSI;
  
  strlen(in_RSI);
  return;
}

Assistant:

void COSOperator::copyToPrimarySelection(const c8 *text) const
{
	if (strlen(text) == 0)
		return;

#if defined(_IRR_COMPILE_WITH_SDL_DEVICE_)
#if SDL_VERSION_ATLEAST(2, 25, 0)
	if (sdl_supports_primary_selection)
		SDL_SetPrimarySelectionText(text);
#endif

#elif defined(_IRR_COMPILE_WITH_X11_DEVICE_)
	if (IrrDeviceLinux)
		IrrDeviceLinux->copyToPrimarySelection(text);
#endif
}